

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeProtoProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,string *proto,
          DescriptorDatabase *fallback_database)

{
  byte bVar1;
  bool bVar2;
  DiskFileToVirtualFileResult DVar4;
  ostream *poVar5;
  char *pcVar6;
  int *piVar7;
  byte bVar8;
  string_view disk_file;
  string_view virtual_file_00;
  string_view virtual_file_01;
  allocator<char> local_199;
  string error_str;
  string virtual_file;
  string shadowing_disk_file;
  string local_138 [8];
  long local_130;
  FileDescriptorProto fallback_file;
  int iVar3;
  
  FileDescriptorProto::FileDescriptorProto(&fallback_file);
  if (fallback_database == (DescriptorDatabase *)0x0) {
    bVar1 = 0;
  }
  else {
    iVar3 = (*fallback_database->_vptr_DescriptorDatabase[2])
                      (fallback_database,proto,&fallback_file);
    bVar1 = (byte)iVar3;
  }
  iVar3 = access((proto->_M_dataplus)._M_p,0);
  virtual_file._M_dataplus._M_p = (pointer)&virtual_file.field_2;
  if (iVar3 < 0) {
    virtual_file._M_string_length = 0;
    virtual_file.field_2._M_local_buf[0] = '\0';
    virtual_file_00._M_str = (proto->_M_dataplus)._M_p;
    virtual_file_00._M_len = proto->_M_string_length;
    bVar2 = DiskSourceTree::VirtualFileToDiskFile(source_tree,virtual_file_00,&virtual_file);
    bVar8 = bVar1 | bVar2;
    if (bVar8 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Could not make proto path relative: ");
      poVar5 = std::operator<<(poVar5,(string *)proto);
      poVar5 = std::operator<<(poVar5,": ");
      pcVar6 = strerror(2);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::~string((string *)&virtual_file);
    goto LAB_0013cfd5;
  }
  virtual_file._M_string_length = 0;
  shadowing_disk_file._M_dataplus._M_p = (pointer)&shadowing_disk_file.field_2;
  shadowing_disk_file._M_string_length = 0;
  virtual_file.field_2._M_local_buf[0] = '\0';
  shadowing_disk_file.field_2._M_local_buf[0] = '\0';
  disk_file._M_str = (proto->_M_dataplus)._M_p;
  disk_file._M_len = proto->_M_string_length;
  DVar4 = DiskSourceTree::DiskFileToVirtualFile
                    (source_tree,disk_file,&virtual_file,&shadowing_disk_file);
  bVar8 = 1;
  switch(DVar4) {
  case SUCCESS:
    std::__cxx11::string::_M_assign((string *)proto);
    break;
  case SHADOWED:
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
    poVar5 = std::operator<<(poVar5,": Input is shadowed in the --proto_path by \"");
    poVar5 = std::operator<<(poVar5,(string *)&shadowing_disk_file);
    poVar5 = std::operator<<(poVar5,
                             "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_0013cfbb:
    bVar8 = 0;
    break;
  case CANNOT_OPEN:
    if (bVar1 == 0) {
      (*(source_tree->super_SourceTree)._vptr_SourceTree[3])(local_138,source_tree);
      if (local_130 == 0) {
        piVar7 = __errno_location();
        pcVar6 = strerror(*piVar7);
        std::__cxx11::string::string<std::allocator<char>>((string *)&error_str,pcVar6,&local_199);
      }
      else {
        (*(source_tree->super_SourceTree)._vptr_SourceTree[3])(&error_str,source_tree);
      }
      std::__cxx11::string::~string(local_138);
      poVar5 = std::operator<<((ostream *)&std::cerr,"Could not map to virtual file: ");
      poVar5 = std::operator<<(poVar5,(string *)proto);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,(string *)&error_str);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&error_str);
      goto LAB_0013cfbb;
    }
    break;
  case NO_MAPPING:
    error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
    error_str._M_string_length = 0;
    error_str.field_2._M_local_buf[0] = '\0';
    virtual_file_01._M_str = (proto->_M_dataplus)._M_p;
    virtual_file_01._M_len = proto->_M_string_length;
    bVar2 = DiskSourceTree::VirtualFileToDiskFile(source_tree,virtual_file_01,&error_str);
    bVar8 = bVar1 | bVar2;
    if (bVar8 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
      poVar5 = std::operator<<(poVar5,
                               ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::~string((string *)&error_str);
  }
  std::__cxx11::string::~string((string *)&shadowing_disk_file);
  std::__cxx11::string::~string((string *)&virtual_file);
LAB_0013cfd5:
  FileDescriptorProto::~FileDescriptorProto(&fallback_file);
  return (bool)bVar8;
}

Assistant:

bool CommandLineInterface::MakeProtoProtoPathRelative(
    DiskSourceTree* source_tree, std::string* proto,
    DescriptorDatabase* fallback_database) {
  // If it's in the fallback db, don't report non-existent file errors.
  FileDescriptorProto fallback_file;
  bool in_fallback_database =
      fallback_database != nullptr &&
      fallback_database->FindFileByName(*proto, &fallback_file);

  // If the input file path is not a physical file path, it must be a virtual
  // path.
  if (access(proto->c_str(), F_OK) < 0) {
    std::string disk_file;
    if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
        in_fallback_database) {
      return true;
    } else {
      std::cerr << "Could not make proto path relative: " << *proto << ": "
                << strerror(ENOENT) << std::endl;
      return false;
    }
  }

  std::string virtual_file, shadowing_disk_file;
  switch (source_tree->DiskFileToVirtualFile(*proto, &virtual_file,
                                             &shadowing_disk_file)) {
    case DiskSourceTree::SUCCESS:
      *proto = virtual_file;
      break;
    case DiskSourceTree::SHADOWED:
      std::cerr << *proto << ": Input is shadowed in the --proto_path by \""
                << shadowing_disk_file
                << "\".  Either use the latter file as your input or reorder "
                   "the --proto_path so that the former file's location "
                   "comes first."
                << std::endl;
      return false;
    case DiskSourceTree::CANNOT_OPEN: {
      if (in_fallback_database) {
        return true;
      }
      std::string error_str = source_tree->GetLastErrorMessage().empty()
                                  ? strerror(errno)
                                  : source_tree->GetLastErrorMessage();
      std::cerr << "Could not map to virtual file: " << *proto << ": "
                << error_str << std::endl;
      return false;
    }
    case DiskSourceTree::NO_MAPPING: {
      // Try to interpret the path as a virtual path.
      std::string disk_file;
      if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
          in_fallback_database) {
        return true;
      } else {
        // The input file path can't be mapped to any --proto_path and it also
        // can't be interpreted as a virtual path.
        std::cerr
            << *proto
            << ": File does not reside within any path "
               "specified using --proto_path (or -I).  You must specify a "
               "--proto_path which encompasses this file.  Note that the "
               "proto_path must be an exact prefix of the .proto file "
               "names -- protoc is too dumb to figure out when two paths "
               "(e.g. absolute and relative) are equivalent (it's harder "
               "than you think)."
            << std::endl;
        return false;
      }
    }
  }
  return true;
}